

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O0

bool __thiscall FDrawInfo::DoFakeCeilingBridge(FDrawInfo *this,subsector_t *subsec,float Planez)

{
  seg_t *psVar1;
  subsector_t *subsec_00;
  bool bVar2;
  sector_t *this_00;
  double dVar3;
  sector_t *sec;
  subsector_t *backsub;
  seg_t *seg;
  uint local_28;
  DWORD i_1;
  DWORD i;
  float Planez_local;
  subsector_t *subsec_local;
  FDrawInfo *this_local;
  
  for (local_28 = 0; local_28 < subsec->numlines; local_28 = local_28 + 1) {
    if (subsec->firstline[local_28].backsector == (sector_t *)0x0) {
      return false;
    }
    if (subsec->firstline[local_28].PartnerSeg == (seg_t *)0x0) {
      return false;
    }
  }
  seg._4_4_ = 0;
  _i = subsec;
  subsec_local = (subsector_t *)this;
  do {
    if (_i->numlines <= seg._4_4_) {
      TArray<subsector_t_*,_subsector_t_*>::Push(&this->HandledSubsectors,(subsector_t **)&i);
      return true;
    }
    psVar1 = _i->firstline;
    subsec_00 = (psVar1[seg._4_4_].PartnerSeg)->Subsector;
    if (subsec_00->validcount != validcount) {
      subsec_00->validcount = validcount;
      if ((psVar1[seg._4_4_].frontsector != psVar1[seg._4_4_].backsector) &&
         (psVar1[seg._4_4_].linedef != (line_t *)0x0)) {
        this_00 = gl_FakeFlat(psVar1[seg._4_4_].backsector,&fakesec,true);
        bVar2 = secplane_t::isSlope(&this_00->ceilingplane);
        if (bVar2) {
          return false;
        }
        dVar3 = sector_t::GetPlaneTexZ(this_00,1);
        if ((double)Planez < dVar3) {
          return false;
        }
        dVar3 = sector_t::GetPlaneTexZ(this_00,1);
        if ((dVar3 == (double)Planez) && (!NAN(dVar3) && !NAN((double)Planez))) goto LAB_0051ccca;
      }
      bVar2 = DoFakeCeilingBridge(this,subsec_00,Planez);
      if (!bVar2) {
        return false;
      }
    }
LAB_0051ccca:
    seg._4_4_ = seg._4_4_ + 1;
  } while( true );
}

Assistant:

bool FDrawInfo::DoFakeCeilingBridge(subsector_t * subsec, float Planez)
{
	// Is there a one-sided wall in this sector?
	// Do this first to avoid unnecessary recursion
	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		if (subsec->firstline[i].backsector == NULL) return false;
		if (subsec->firstline[i].PartnerSeg == NULL) return false;
	}

	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		seg_t * seg = subsec->firstline + i;
		subsector_t * backsub = seg->PartnerSeg->Subsector;

		// already checked?
		if (backsub->validcount == validcount) continue;
		backsub->validcount = validcount;

		if (seg->frontsector != seg->backsector && seg->linedef)
		{
			// Note: if this is a real line between sectors
			// we can be sure that render_sector is the real sector!

			sector_t * sec = gl_FakeFlat(seg->backsector, &fakesec, true);

			// Don't bother with slopes
			if (sec->ceilingplane.isSlope())  return false;

			// Is the neighboring ceiling higher than the desired height?
			if (sec->GetPlaneTexZ(sector_t::ceiling) > Planez)
			{
				// todo: check for missing textures.
				return false;
			}

			// This is an exact height match which means we don't have to do any further checks for this sector
			// No texture checks though! 
			if (sec->GetPlaneTexZ(sector_t::ceiling) == Planez) continue;
		}
		if (!DoFakeCeilingBridge(backsub, Planez)) return false;
	}
	// all checked ok. This sector is part of the current fake plane

	HandledSubsectors.Push(subsec);
	return 1;
}